

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

appender fmt::v8::detail::write_int_localized<fmt::v8::appender,unsigned_long,char>
                   (appender out,unsigned_long value,uint prefix,basic_format_specs<char> *specs,
                   digit_grouping<char> *grouping)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  appender aVar5;
  ulong size;
  byte *pbVar6;
  byte *pbVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int num_digits;
  char digits [40];
  int local_80;
  uint local_7c;
  anon_class_32_4_dca7119b local_78;
  char local_58 [48];
  
  lVar2 = 0x3f;
  if ((value | 1) != 0) {
    for (; (value | 1) >> lVar2 == 0; lVar2 = lVar2 + -1) {
    }
  }
  local_80 = (uint)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar2] -
             (uint)(value < *(ulong *)(do_count_digits(unsigned_long)::zero_or_powers_of_10 +
                                      (ulong)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar2]
                                      * 8));
  local_7c = prefix;
  format_decimal<char,unsigned_long>(local_58,value,local_80);
  pbVar6 = (byte *)(grouping->sep_).grouping._M_dataplus._M_p;
  pbVar7 = pbVar6 + (grouping->sep_).grouping._M_string_length;
  iVar8 = 0;
  iVar4 = local_80 + -1;
  do {
    iVar3 = iVar4;
    iVar10 = 0x7fffffff;
    if ((grouping->sep_).thousands_sep != '\0') {
      if (pbVar6 == pbVar7) {
        uVar9 = (uint)(char)pbVar7[-1];
      }
      else {
        bVar1 = *pbVar6;
        if ((byte)(bVar1 + 0x81) < 0x82) goto LAB_00120cb9;
        pbVar6 = pbVar6 + 1;
        uVar9 = (uint)bVar1;
      }
      iVar8 = iVar8 + uVar9;
      iVar10 = iVar8;
    }
LAB_00120cb9:
    iVar4 = iVar3 + 1;
    if (local_80 <= iVar10) {
      size = (ulong)((iVar3 + 2) - (uint)(local_7c == 0));
      local_78.prefix = &local_7c;
      local_78.num_digits = &local_80;
      local_78.grouping = grouping;
      local_78.digits = (char (*) [40])local_58;
      aVar5 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int_localized<fmt::v8::appender,unsigned_long,char>(fmt::v8::appender,unsigned_long,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::digit_grouping<char>const&)::_lambda(fmt::v8::appender)_1_>
                        (out,specs,size,size,&local_78);
      return (appender)aVar5.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
    }
  } while( true );
}

Assistant:

auto write_int_localized(OutputIt out, UInt value, unsigned prefix,
                         const basic_format_specs<Char>& specs,
                         const digit_grouping<Char>& grouping) -> OutputIt {
  static_assert(std::is_same<uint64_or_128_t<UInt>, UInt>::value, "");
  int num_digits = count_digits(value);
  char digits[40];
  format_decimal(digits, value, num_digits);
  unsigned size = to_unsigned((prefix != 0 ? 1 : 0) + num_digits +
                              grouping.count_separators(num_digits));
  return write_padded<align::right>(
      out, specs, size, size, [&](reserve_iterator<OutputIt> it) {
        if (prefix != 0) *it++ = static_cast<Char>(prefix);
        return grouping.apply(it, string_view(digits, to_unsigned(num_digits)));
      });
}